

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRenderer.cpp
# Opt level: O2

void rr::anon_unknown_19::convertPrimitiveToBaseType
               (vector<rr::pa::Line,_std::allocator<rr::pa::Line>_> *output,
               vector<rr::pa::LineAdjacency,_std::allocator<rr::pa::LineAdjacency>_> *input)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  int iVar3;
  pointer pLVar4;
  pointer pLVar5;
  undefined8 uVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  
  std::vector<rr::pa::Line,_std::allocator<rr::pa::Line>_>::resize
            (output,((long)(input->
                           super__Vector_base<rr::pa::LineAdjacency,_std::allocator<rr::pa::LineAdjacency>_>
                           )._M_impl.super__Vector_impl_data._M_finish -
                    (long)(input->
                          super__Vector_base<rr::pa::LineAdjacency,_std::allocator<rr::pa::LineAdjacency>_>
                          )._M_impl.super__Vector_impl_data._M_start) / 0x28);
  lVar7 = 0x10;
  lVar8 = 0x20;
  for (uVar9 = 0;
      pLVar4 = (input->
               super__Vector_base<rr::pa::LineAdjacency,_std::allocator<rr::pa::LineAdjacency>_>).
               _M_impl.super__Vector_impl_data._M_start,
      uVar9 < (ulong)(((long)(input->
                             super__Vector_base<rr::pa::LineAdjacency,_std::allocator<rr::pa::LineAdjacency>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (long)pLVar4) / 0x28);
      uVar9 = uVar9 + 1) {
    iVar3 = *(int *)((long)&pLVar4->v0 + lVar8);
    pLVar5 = (output->super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>)._M_impl.
             super__Vector_impl_data._M_start;
    puVar1 = (undefined8 *)((long)pLVar4 + lVar8 + -0x18);
    uVar6 = puVar1[1];
    puVar2 = (undefined8 *)((long)pLVar5 + lVar7 + -0x10);
    *puVar2 = *puVar1;
    puVar2[1] = uVar6;
    *(int *)((long)&pLVar5->v0 + lVar7) = iVar3 + -1;
    lVar7 = lVar7 + 0x18;
    lVar8 = lVar8 + 0x28;
  }
  return;
}

Assistant:

void convertPrimitiveToBaseType(std::vector<pa::Line>& output, std::vector<pa::LineAdjacency>& input)
{
	output.resize(input.size());
	for (size_t i = 0; i < input.size(); ++i)
	{
		const int adjacentProvokingVertex	= input[i].provokingIndex;
		const int baseProvokingVertexIndex	= adjacentProvokingVertex-1;
		output[i] = pa::Line(input[i].v1, input[i].v2, baseProvokingVertexIndex);
	}
}